

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegen.cpp
# Opt level: O2

void RegenerateCmakeAddSubdirectory(ostream *o,Component *comp)

{
  type_conflict tVar1;
  bool bVar2;
  reference lhs;
  ostream *poVar3;
  _Base_ptr p_Var4;
  directory_iterator it;
  directory_iterator end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> subdir;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subdirs;
  directory_iterator local_b0;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_50 [32];
  
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::filesystem::directory_iterator::directory_iterator(&local_b0,&comp->root,none);
  local_a8.px = (dir_itr_imp *)0x0;
  while( true ) {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                        *)&local_b0,
                       (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                        *)&local_a8);
    if (!tVar1) break;
    lhs = boost::filesystem::directory_iterator::dereference(&local_b0);
    boost::filesystem::path::path((path *)local_50,"CMakeLists.txt");
    boost::filesystem::operator/((path *)&local_a0,(path *)lhs,(path *)local_50);
    bVar2 = boost::filesystem::is_regular_file((path *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string(local_50);
    if (bVar2) {
      boost::filesystem::directory_iterator::dereference(&local_b0);
      boost::filesystem::path::filename();
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_80,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    boost::filesystem::directory_iterator::increment(&local_b0);
  }
  for (p_Var4 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &local_80._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    std::__cxx11::string::string((string *)&local_a0,(string *)(p_Var4 + 1));
    poVar3 = std::operator<<(o,"add_subdirectory(");
    poVar3 = std::operator<<(poVar3,(string *)&local_a0);
    std::operator<<(poVar3,")\n");
    std::__cxx11::string::~string((string *)&local_a0);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_a8);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_b0.m_imp);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_80);
  return;
}

Assistant:

void RegenerateCmakeAddSubdirectory(std::ostream& o,
                                    const Component& comp)
{
    // Temporary uses a set to sort subdirectories
    std::set<std::string> subdirs;
    filesystem::directory_iterator it(comp.root), end;
    for (; it != end; ++it) {
        if (filesystem::is_regular_file(it->path() / "CMakeLists.txt")) {
            subdirs.insert(it->path().filename().generic_string());
        }
    }
    for (auto subdir : subdirs) {
        o << "add_subdirectory(" << subdir << ")\n";
    }
        
}